

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * parse_function(gravity_parser_t *parser,_Bool is_declaration,gtoken_t access_specifier,
                        gtoken_t storage_specifier)

{
  gravity_lexer_t *lexer;
  gtoken_s token_00;
  _Bool _Var1;
  gtoken_t gVar2;
  gtoken_t gVar3;
  char *pcVar4;
  gnode_t *pgVar5;
  gnode_r *pgVar6;
  gnode_t **ppgVar7;
  gnode_t *pgVar8;
  gnode_r *pgVar9;
  size_t sVar10;
  size_t sVar11;
  bool bVar12;
  gtoken_s token;
  _Bool has_default_values;
  undefined7 uStack_57;
  uint32_t uStack_50;
  uint32_t uStack_4c;
  uint32_t local_48;
  uint32_t uStack_44;
  uint32_t uStack_40;
  gbuiltin_t gStack_3c;
  char *local_38;
  
  lexer = parser->lexer->p[parser->lexer->n - 1];
  gVar2 = gravity_lexer_peek(lexer);
  gravity_lexer_token(lexer);
  if (gVar2 != TOK_OP_OPEN_CURLYBRACE) {
    gVar3 = gravity_lexer_next(lexer);
    gravity_lexer_token(lexer);
    token.value = local_38;
    token._1_7_ = uStack_57;
    token.type._0_1_ = has_default_values;
    token.bytes = local_48;
    token.length = uStack_44;
    token.fileid = uStack_40;
    token.builtin = gStack_3c;
    token.colno = uStack_50;
    token.position = uStack_4c;
    if (gVar3 != TOK_KEY_FUNC) {
      report_error(parser,GRAVITY_ERROR_SYNTAX,0x140401);
      return (gnode_t *)0x0;
    }
  }
  if (is_declaration) {
    gVar3 = gravity_lexer_peek(lexer);
    _Var1 = token_isoperator(gVar3);
    if (_Var1) {
      gVar3 = gravity_lexer_next(lexer);
      pcVar4 = token_name(gVar3);
      pcVar4 = string_dup(pcVar4);
    }
    else {
      pcVar4 = parse_identifier(parser);
    }
  }
  else {
    pcVar4 = (char *)0x0;
  }
  sVar10 = parser->declarations->n;
  if (sVar10 == 0) {
    pgVar5 = (gnode_t *)0x0;
  }
  else {
    pgVar5 = parser->declarations->p[sVar10 - 1];
  }
  token_00.colno = token.colno;
  token_00.type = token.type;
  token_00.lineno = token.lineno;
  token_00.position = token.position;
  token_00.bytes = token.bytes;
  token_00.length = token.length;
  token_00.fileid = token.fileid;
  token_00.builtin = token.builtin;
  token_00.value = token.value;
  pgVar5 = gnode_function_decl_create
                     (token_00,pcVar4,access_specifier,storage_specifier,(gnode_r *)0x0,
                      (gnode_compound_stmt_t *)0x0,pgVar5);
  if (gVar2 != TOK_OP_OPEN_CURLYBRACE) {
    parse_required(parser,TOK_OP_OPEN_PARENTHESIS);
  }
  has_default_values = false;
  pgVar6 = parse_optional_parameter_declaration
                     (parser,gVar2 == TOK_OP_OPEN_CURLYBRACE,&has_default_values);
  if (gVar2 != TOK_OP_OPEN_CURLYBRACE) {
    parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
  }
  pgVar9 = parser->declarations;
  sVar10 = pgVar9->n;
  if (sVar10 == pgVar9->m) {
    sVar11 = 8;
    if (sVar10 != 0) {
      sVar11 = sVar10 * 2;
    }
    pgVar9->m = sVar11;
    ppgVar7 = (gnode_t **)realloc(pgVar9->p,sVar11 << 3);
    pgVar9 = parser->declarations;
    pgVar9->p = ppgVar7;
    sVar10 = pgVar9->n;
  }
  else {
    ppgVar7 = pgVar9->p;
  }
  pgVar9->n = sVar10 + 1;
  ppgVar7[sVar10] = pgVar5;
  pgVar8 = parse_compound_statement(parser);
  parser->declarations->n = parser->declarations->n - 1;
  sVar10 = (parser->vdecl).n;
  if (sVar10 == 0) {
    *(undefined1 *)((long)&pgVar5[1].token.value + 5) = 0;
  }
  else {
    bVar12 = (parser->vdecl).p[sVar10 - 1] == 1;
    *(bool *)((long)&pgVar5[1].token.value + 5) = bVar12;
    if (bVar12) goto LAB_00118c04;
  }
  parse_semicolon(parser);
LAB_00118c04:
  *(_Bool *)((long)&pgVar5[1].token.value + 4) = has_default_values;
  *(gnode_r **)&pgVar5[1].token.bytes = pgVar6;
  *(gnode_t **)&pgVar5[1].token.fileid = pgVar8;
  return pgVar5;
}

Assistant:

gnode_t *parse_function (gravity_parser_t *parser, bool is_declaration, gtoken_t access_specifier, gtoken_t storage_specifier) {
    DECLARE_LEXER;

    // access_specifier? storage_specifier? already parsed
    // 'function' IDENTIFIER '(' parameter_declaration_clause? ')' compound_statement

    // consume FUNC keyword (or peek for OPEN_CURLYBRACE)
    bool is_implicit = (gravity_lexer_peek(lexer) == TOK_OP_OPEN_CURLYBRACE);
    gtoken_s token = gravity_lexer_token(lexer);
    if (!is_implicit) {
        gtoken_t type = gravity_lexer_next(lexer);
        token = gravity_lexer_token(lexer);
        if (type != TOK_KEY_FUNC) {
            REPORT_ERROR(token, "Invalid function expression.");
            return NULL;
        }
    }

    // parse IDENTIFIER
    const char *identifier = NULL;
    if (is_declaration) {
        gtoken_t peek = gravity_lexer_peek(lexer);
        identifier = (token_isoperator(peek)) ? string_dup(token_name(gravity_lexer_next(lexer))) : parse_identifier(parser);
        DEBUG_PARSER("parse_function_declaration %s", identifier);
    }

    // create func declaration node
    gnode_function_decl_t *func = (gnode_function_decl_t *) gnode_function_decl_create(token, identifier, access_specifier, storage_specifier, NULL, NULL, LAST_DECLARATION());

    // check and consume TOK_OP_OPEN_PARENTHESIS
    if (!is_implicit) parse_required(parser, TOK_OP_OPEN_PARENTHESIS);

    // parse optional parameter declaration clause
    bool has_default_values = false;
    gnode_r *params = parse_optional_parameter_declaration(parser, is_implicit, &has_default_values);

    // check and consume TOK_OP_CLOSED_PARENTHESIS
    if (!is_implicit) parse_required(parser, TOK_OP_CLOSED_PARENTHESIS);

    // parse compound statement
    PUSH_DECLARATION(func);
    gnode_compound_stmt_t *compound = (gnode_compound_stmt_t*)parse_compound_statement(parser);
    POP_DECLARATION();

    // if func is declarared inside a variable declaration node then the semicolon check must be
    // performed once at variable declaration node level ad not inside the func node
    bool is_inside_var_declaration = ((marray_size(parser->vdecl) > 0) && (marray_last(parser->vdecl) == 1));
    func->is_closure = is_inside_var_declaration;
    
    // parse optional semicolon
    if (!is_inside_var_declaration) parse_semicolon(parser);

    // finish func setup
    func->has_defaults = has_default_values;
    func->params = params;
    func->block = compound;
    return (gnode_t *)func;
}